

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# noise_model.c
# Opt level: O0

int aom_flat_block_finder_run
              (aom_flat_block_finder_t *block_finder,uint8_t *data,int w,int h,int stride,
              uint8_t *flat_blocks)

{
  float fVar1;
  int iVar2;
  undefined1 uVar3;
  int iVar4;
  int iVar5;
  void *pvVar6;
  void *pvVar7;
  void *__base;
  int in_ECX;
  long lVar8;
  int in_EDX;
  long in_RDI;
  long in_R9;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double *pdVar13;
  int i;
  float score_threshold;
  int top_nth_percentile;
  float score;
  double sum_weights;
  double weights [5];
  int is_flat;
  double ratio;
  double norm;
  double e2;
  double e1;
  double det;
  double trace;
  double value;
  double gy;
  double gx;
  int xi;
  int yi;
  double var;
  double mean;
  double Gyy;
  double Gxy;
  double Gxx;
  int bx;
  int by;
  index_and_score_t *scores;
  double *block;
  double *plane;
  int num_flat;
  int num_blocks_h;
  int num_blocks_w;
  double kVarThreshold;
  double kNormThreshold;
  double kRatioThreshold;
  double kTraceThreshold;
  int n;
  int block_size;
  void *in_stack_fffffffffffffe70;
  float local_178;
  bool local_171;
  double local_170;
  int local_150;
  undefined8 local_138;
  undefined8 local_130;
  undefined8 local_128;
  undefined8 local_120;
  undefined8 in_stack_fffffffffffffee8;
  int in_stack_fffffffffffffef0;
  int in_stack_fffffffffffffef4;
  undefined4 in_stack_fffffffffffffef8;
  uint in_stack_fffffffffffffefc;
  aom_flat_block_finder_t *in_stack_ffffffffffffff00;
  double in_stack_ffffffffffffff10;
  double *in_stack_ffffffffffffff18;
  double *in_stack_ffffffffffffff20;
  int local_b8;
  int local_b4;
  double local_b0;
  double local_a8;
  double local_a0;
  double local_98;
  double local_90;
  int local_88;
  int local_84;
  int local_64;
  int local_4;
  
  iVar2 = *(int *)(in_RDI + 0x14);
  dVar9 = 0.005 / (double)(iVar2 * iVar2);
  iVar4 = (in_EDX + iVar2 + -1) / iVar2;
  iVar5 = (in_ECX + iVar2 + -1) / iVar2;
  local_64 = 0;
  pvVar6 = aom_malloc(0x1a455a);
  pvVar7 = aom_malloc(0x1a4573);
  __base = aom_malloc(0x1a4596);
  if (((pvVar6 == (void *)0x0) || (pvVar7 == (void *)0x0)) || (__base == (void *)0x0)) {
    fprintf(_stderr,"Failed to allocate memory for block of size %d\n",(ulong)(uint)(iVar2 * iVar2))
    ;
    aom_free(in_stack_fffffffffffffe70);
    aom_free(in_stack_fffffffffffffe70);
    aom_free(in_stack_fffffffffffffe70);
    local_4 = -1;
  }
  else {
    for (local_84 = 0; local_84 < iVar5; local_84 = local_84 + 1) {
      for (local_88 = 0; local_88 < iVar4; local_88 = local_88 + 1) {
        in_stack_fffffffffffffe70 = pvVar6;
        aom_flat_block_finder_extract_block
                  (in_stack_ffffffffffffff00,
                   (uint8_t *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8),
                   in_stack_fffffffffffffef4,in_stack_fffffffffffffef0,
                   (int)((ulong)in_stack_fffffffffffffee8 >> 0x20),(int)in_stack_fffffffffffffee8,
                   SUB84(in_stack_ffffffffffffff10,0),in_stack_ffffffffffffff18,
                   in_stack_ffffffffffffff20);
        local_90 = 0.0;
        local_98 = 0.0;
        local_a0 = 0.0;
        local_a8 = 0.0;
        local_b0 = 0.0;
        for (local_b4 = 1; local_b4 < iVar2 + -1; local_b4 = local_b4 + 1) {
          for (local_b8 = 1; local_b8 < iVar2 + -1; local_b8 = local_b8 + 1) {
            dVar10 = (*(double *)((long)pvVar7 + (long)(local_b4 * iVar2 + local_b8 + 1) * 8) -
                     *(double *)((long)pvVar7 + (long)(local_b4 * iVar2 + local_b8 + -1) * 8)) / 2.0
            ;
            dVar11 = (*(double *)((long)pvVar7 + (long)(local_b4 * iVar2 + local_b8 + iVar2) * 8) -
                     *(double *)((long)pvVar7 + (long)((local_b4 * iVar2 + local_b8) - iVar2) * 8))
                     / 2.0;
            local_90 = dVar10 * dVar10 + local_90;
            local_98 = dVar10 * dVar11 + local_98;
            local_a0 = dVar11 * dVar11 + local_a0;
            dVar10 = *(double *)((long)pvVar7 + (long)(local_b4 * iVar2 + local_b8) * 8);
            local_a8 = dVar10 + local_a8;
            local_b0 = dVar10 * dVar10 + local_b0;
          }
        }
        local_a8 = local_a8 / (double)((iVar2 + -2) * (iVar2 + -2));
        local_90 = local_90 / (double)((iVar2 + -2) * (iVar2 + -2));
        local_98 = local_98 / (double)((iVar2 + -2) * (iVar2 + -2));
        local_a0 = local_a0 / (double)((iVar2 + -2) * (iVar2 + -2));
        dVar10 = -local_a8 * local_a8 + local_b0 / (double)((iVar2 + -2) * (iVar2 + -2));
        dVar11 = local_90 + local_a0;
        in_stack_ffffffffffffff20 = (double *)(local_90 * local_a0 + -(local_98 * local_98));
        dVar12 = sqrt(dVar11 * dVar11 + -((double)in_stack_ffffffffffffff20 * 4.0));
        pdVar13 = (double *)((dVar11 + dVar12) / 2.0);
        dVar12 = sqrt(dVar11 * dVar11 + -((double)in_stack_ffffffffffffff20 * 4.0));
        in_stack_ffffffffffffff10 = (dVar11 - dVar12) / 2.0;
        local_170 = in_stack_ffffffffffffff10;
        if (in_stack_ffffffffffffff10 <= 1e-06) {
          local_170 = 1e-06;
        }
        in_stack_ffffffffffffff00 = (aom_flat_block_finder_t *)((double)pdVar13 / local_170);
        local_171 = false;
        if (((dVar11 < 0.000146484375) &&
            (local_171 = false, (double)in_stack_ffffffffffffff00 < 1.25)) &&
           (local_171 = false, (double)pdVar13 < 7.8125e-05)) {
          local_171 = dVar9 < dVar10;
        }
        in_stack_fffffffffffffefc = (uint)local_171;
        in_stack_ffffffffffffff18 = pdVar13;
        memset(&local_138,0,0x28);
        local_138 = 0xc0ba1a0000000000;
        local_130 = 0xbfca5119ce075f70;
        local_128 = 0x40c98f8000000000;
        local_120 = 0xc0c8490000000000;
        in_stack_fffffffffffffee8 = 0x40048e219652bd3c;
        dVar11 = fclamp((double)pdVar13 * -12434.0 +
                        dVar11 * 13087.0 +
                        dVar10 * -6682.0 + (double)in_stack_ffffffffffffff00 * -0.2056 + 2.5694,
                        -25.0,100.0);
        dVar11 = exp(-dVar11);
        local_178 = (float)(1.0 / (dVar11 + 1.0));
        uVar3 = 0;
        if (in_stack_fffffffffffffefc != 0) {
          uVar3 = 0xff;
        }
        *(undefined1 *)(in_R9 + (local_84 * iVar4 + local_88)) = uVar3;
        if (dVar10 <= dVar9) {
          local_178 = 0.0;
        }
        *(float *)((long)__base + (long)(local_84 * iVar4 + local_88) * 8 + 4) = local_178;
        *(int *)((long)__base + (long)(local_84 * iVar4 + local_88) * 8) =
             local_84 * iVar4 + local_88;
        local_64 = in_stack_fffffffffffffefc + local_64;
      }
    }
    qsort(__base,(long)(iVar4 * iVar5),8,compare_scores);
    fVar1 = *(float *)((long)__base + (long)((iVar4 * iVar5 * 0x5a) / 100) * 8 + 4);
    for (local_150 = 0; local_150 < iVar4 * iVar5; local_150 = local_150 + 1) {
      if (fVar1 <= *(float *)((long)__base + (long)local_150 * 8 + 4)) {
        local_64 = (uint)(*(char *)(in_R9 + *(int *)((long)__base + (long)local_150 * 8)) == '\0') +
                   local_64;
        lVar8 = (long)*(int *)((long)__base + (long)local_150 * 8);
        *(byte *)(in_R9 + lVar8) = *(byte *)(in_R9 + lVar8) | 1;
      }
    }
    aom_free(in_stack_fffffffffffffe70);
    aom_free(in_stack_fffffffffffffe70);
    aom_free(in_stack_fffffffffffffe70);
    local_4 = local_64;
  }
  return local_4;
}

Assistant:

int aom_flat_block_finder_run(const aom_flat_block_finder_t *block_finder,
                              const uint8_t *const data, int w, int h,
                              int stride, uint8_t *flat_blocks) {
  // The gradient-based features used in this code are based on:
  //  A. Kokaram, D. Kelly, H. Denman and A. Crawford, "Measuring noise
  //  correlation for improved video denoising," 2012 19th, ICIP.
  // The thresholds are more lenient to allow for correct grain modeling
  // if extreme cases.
  const int block_size = block_finder->block_size;
  const int n = block_size * block_size;
  const double kTraceThreshold = 0.15 / (32 * 32);
  const double kRatioThreshold = 1.25;
  const double kNormThreshold = 0.08 / (32 * 32);
  const double kVarThreshold = 0.005 / (double)n;
  const int num_blocks_w = (w + block_size - 1) / block_size;
  const int num_blocks_h = (h + block_size - 1) / block_size;
  int num_flat = 0;
  double *plane = (double *)aom_malloc(n * sizeof(*plane));
  double *block = (double *)aom_malloc(n * sizeof(*block));
  index_and_score_t *scores = (index_and_score_t *)aom_malloc(
      num_blocks_w * num_blocks_h * sizeof(*scores));
  if (plane == NULL || block == NULL || scores == NULL) {
    fprintf(stderr, "Failed to allocate memory for block of size %d\n", n);
    aom_free(plane);
    aom_free(block);
    aom_free(scores);
    return -1;
  }

#ifdef NOISE_MODEL_LOG_SCORE
  fprintf(stderr, "score = [");
#endif
  for (int by = 0; by < num_blocks_h; ++by) {
    for (int bx = 0; bx < num_blocks_w; ++bx) {
      // Compute gradient covariance matrix.
      aom_flat_block_finder_extract_block(block_finder, data, w, h, stride,
                                          bx * block_size, by * block_size,
                                          plane, block);
      double Gxx = 0, Gxy = 0, Gyy = 0;
      double mean = 0;
      double var = 0;

      for (int yi = 1; yi < block_size - 1; ++yi) {
        for (int xi = 1; xi < block_size - 1; ++xi) {
          const double gx = (block[yi * block_size + xi + 1] -
                             block[yi * block_size + xi - 1]) /
                            2;
          const double gy = (block[yi * block_size + xi + block_size] -
                             block[yi * block_size + xi - block_size]) /
                            2;
          Gxx += gx * gx;
          Gxy += gx * gy;
          Gyy += gy * gy;

          const double value = block[yi * block_size + xi];
          mean += value;
          var += value * value;
        }
      }
      mean /= (block_size - 2) * (block_size - 2);

      // Normalize gradients by block_size.
      Gxx /= ((block_size - 2) * (block_size - 2));
      Gxy /= ((block_size - 2) * (block_size - 2));
      Gyy /= ((block_size - 2) * (block_size - 2));
      var = var / ((block_size - 2) * (block_size - 2)) - mean * mean;

      {
        const double trace = Gxx + Gyy;
        const double det = Gxx * Gyy - Gxy * Gxy;
        const double e1 = (trace + sqrt(trace * trace - 4 * det)) / 2.;
        const double e2 = (trace - sqrt(trace * trace - 4 * det)) / 2.;
        const double norm = e1;  // Spectral norm
        const double ratio = (e1 / AOMMAX(e2, 1e-6));
        const int is_flat = (trace < kTraceThreshold) &&
                            (ratio < kRatioThreshold) &&
                            (norm < kNormThreshold) && (var > kVarThreshold);
        // The following weights are used to combine the above features to give
        // a sigmoid score for flatness. If the input was normalized to [0,100]
        // the magnitude of these values would be close to 1 (e.g., weights
        // corresponding to variance would be a factor of 10000x smaller).
        // The weights are given in the following order:
        //    [{var}, {ratio}, {trace}, {norm}, offset]
        // with one of the most discriminative being simply the variance.
        const double weights[5] = { -6682, -0.2056, 13087, -12434, 2.5694 };
        double sum_weights = weights[0] * var + weights[1] * ratio +
                             weights[2] * trace + weights[3] * norm +
                             weights[4];
        // clamp the value to [-25.0, 100.0] to prevent overflow
        sum_weights = fclamp(sum_weights, -25.0, 100.0);
        const float score = (float)(1.0 / (1 + exp(-sum_weights)));
        flat_blocks[by * num_blocks_w + bx] = is_flat ? 255 : 0;
        scores[by * num_blocks_w + bx].score = var > kVarThreshold ? score : 0;
        scores[by * num_blocks_w + bx].index = by * num_blocks_w + bx;
#ifdef NOISE_MODEL_LOG_SCORE
        fprintf(stderr, "%g %g %g %g %g %d ", score, var, ratio, trace, norm,
                is_flat);
#endif
        num_flat += is_flat;
      }
    }
#ifdef NOISE_MODEL_LOG_SCORE
    fprintf(stderr, "\n");
#endif
  }
#ifdef NOISE_MODEL_LOG_SCORE
  fprintf(stderr, "];\n");
#endif
  // Find the top-scored blocks (most likely to be flat) and set the flat blocks
  // be the union of the thresholded results and the top 10th percentile of the
  // scored results.
  qsort(scores, num_blocks_w * num_blocks_h, sizeof(*scores), &compare_scores);
  const int top_nth_percentile = num_blocks_w * num_blocks_h * 90 / 100;
  const float score_threshold = scores[top_nth_percentile].score;
  for (int i = 0; i < num_blocks_w * num_blocks_h; ++i) {
    if (scores[i].score >= score_threshold) {
      num_flat += flat_blocks[scores[i].index] == 0;
      flat_blocks[scores[i].index] |= 1;
    }
  }
  aom_free(block);
  aom_free(plane);
  aom_free(scores);
  return num_flat;
}